

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::lts_20240722::debugging_internal::ParseDigit(State *state,int *digit)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  char c;
  int *digit_local;
  State *state_local;
  
  pcVar3 = RemainingInput(state);
  cVar1 = *pcVar3;
  bVar2 = ParseCharClass(state,"0123456789");
  if (bVar2) {
    if (digit != (int *)0x0) {
      *digit = cVar1 + -0x30;
    }
    state_local._7_1_ = true;
  }
  else {
    state_local._7_1_ = false;
  }
  return state_local._7_1_;
}

Assistant:

static bool ParseDigit(State *state, int *digit) {
  char c = RemainingInput(state)[0];
  if (ParseCharClass(state, "0123456789")) {
    if (digit != nullptr) {
      *digit = c - '0';
    }
    return true;
  }
  return false;
}